

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_table.c
# Opt level: O1

int lj_cf_table_maxn(lua_State *L)

{
  ulong uVar1;
  TValue *pTVar2;
  bool bVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  uint *puVar7;
  ulong uVar8;
  double dVar9;
  double dVar10;
  
  pTVar2 = L->base;
  if ((L->top <= pTVar2) || ((pTVar2->field_2).it != 0xfffffff4)) {
    lj_err_argt(L,1,5);
  }
  uVar4 = (ulong)(pTVar2->u32).lo;
  uVar8 = (ulong)*(uint *)(uVar4 + 0x18);
  do {
    if ((long)uVar8 < 1) {
      dVar9 = 0.0;
      goto LAB_001454e4;
    }
    uVar1 = uVar8 - 1;
    lVar5 = uVar8 * 8;
    uVar8 = uVar1;
  } while (*(int *)(((ulong)*(uint *)(uVar4 + 8) - 4) + lVar5) == -1);
  dVar9 = (double)(int)uVar1;
LAB_001454e4:
  puVar7 = (uint *)((ulong)*(uint *)(uVar4 + 0x14) + (ulong)*(uint *)(uVar4 + 0x1c) * 0x18 + 0xc);
  lVar5 = (ulong)*(uint *)(uVar4 + 0x1c) + 1;
  do {
    dVar10 = dVar9;
    if (((puVar7[-2] != 0xffffffff) && (*puVar7 < 0xffff0000)) &&
       (dVar10 = *(double *)(puVar7 + -1), *(double *)(puVar7 + -1) <= dVar9)) {
      dVar10 = dVar9;
    }
    puVar7 = puVar7 + -6;
    lVar6 = lVar5 + -1;
    bVar3 = 0 < lVar5;
    lVar5 = lVar6;
    dVar9 = dVar10;
  } while (lVar6 != 0 && bVar3);
  L->top[-1].n = dVar10;
  return 1;
}

Assistant:

LJLIB_CF(table_maxn)
{
  GCtab *t = lj_lib_checktab(L, 1);
  TValue *array = tvref(t->array);
  Node *node;
  lua_Number m = 0;
  ptrdiff_t i;
  for (i = (ptrdiff_t)t->asize - 1; i >= 0; i--)
    if (!tvisnil(&array[i])) {
      m = (lua_Number)(int32_t)i;
      break;
    }
  node = noderef(t->node);
  for (i = (ptrdiff_t)t->hmask; i >= 0; i--)
    if (!tvisnil(&node[i].val) && tvisnumber(&node[i].key)) {
      lua_Number n = numberVnum(&node[i].key);
      if (n > m) m = n;
    }
  setnumV(L->top-1, m);
  return 1;
}